

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

void Ssw_MatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pObj;
  void *pvVar5;
  char *__function;
  int i;
  char *__assertion;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(p);
  uVar7 = 0xffffffff;
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((pObj != (Aig_Obj_t *)0x0) &&
       (((uVar2 = *(uint *)&pObj->field_0x18 & 7, uVar2 == 2 || (uVar2 - 5 < 2)) &&
        ((pObj->field_5).pData == (void *)0x0)))) {
      iVar3 = Saig_ObjIsLo(p,pObj);
      if (iVar3 != 0) {
        iVar3 = Saig_ObjIsLo(p,pObj);
        if (iVar3 == 0) {
          __assertion = "Saig_ObjIsLo(p, pObj)";
          __function = "Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)";
          uVar7 = 0x56;
LAB_005668c8:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                        ,uVar7,__function);
        }
        pVVar1 = p->vCos;
        iVar3 = p->nTruePos;
        iVar4 = Aig_ObjCioId(pObj);
        pvVar5 = Vec_PtrEntry(pVVar1,(iVar3 + iVar4) - p->nTruePis);
        pAVar6 = (Aig_Obj_t *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe);
        if ((((pAVar6->field_5).pData != (void *)0x0) && (pAVar6->TravId != p->nTravIds)) &&
           (iVar3 = Aig_ObjIsConst1(pAVar6), iVar3 == 0)) {
          pAVar6->TravId = p->nTravIds;
          Vec_PtrPush(vNodes,pAVar6);
        }
      }
      if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
        pvVar5 = (void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
        if ((*(long *)((long)pvVar5 + 0x28) != 0) && (*(int *)((long)pvVar5 + 0x20) != p->nTravIds))
        {
          *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
          Vec_PtrPush(vNodes,pvVar5);
        }
        pvVar5 = (void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        if ((*(long *)((long)pvVar5 + 0x28) != 0) && (*(int *)((long)pvVar5 + 0x20) != p->nTravIds))
        {
          *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
          Vec_PtrPush(vNodes,pvVar5);
        }
      }
      if (p->pFanData == (int *)0x0) {
        __assert_fail("p->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                      ,0xa7,"void Ssw_MatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
      }
      for (uVar2 = 0; uVar2 < *(uint *)&pObj->field_0x18 >> 6; uVar2 = uVar2 + 1) {
        if (uVar2 == 0) {
          if (p->nFansAlloc <= pObj->Id) {
            __assert_fail("ObjId < p->nFansAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
          }
          iVar3 = pObj->Id * 5;
        }
        else {
          if (p->nFansAlloc <= (int)uVar7 / 2) {
            __assert_fail("iFan/2 < p->nFansAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
          }
          iVar3 = ((int)uVar7 >> 1) * 5 + (uVar7 & 1) + 3;
        }
        uVar7 = p->pFanData[iVar3];
        pAVar6 = Aig_ManObj(p,(int)uVar7 >> 1);
        if (((*(uint *)&pAVar6->field_0x18 & 7) != 3) ||
           (iVar3 = Aig_ObjCioId(pAVar6), p->nTruePos <= iVar3)) {
          iVar3 = Saig_ObjIsLi(p,pAVar6);
          if (iVar3 != 0) {
            iVar3 = Saig_ObjIsLi(p,pAVar6);
            if (iVar3 == 0) {
              __assertion = "Saig_ObjIsLi(p, pObj)";
              __function = "Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)";
              uVar7 = 0x57;
              goto LAB_005668c8;
            }
            pVVar1 = p->vCis;
            iVar3 = p->nTruePis;
            iVar4 = Aig_ObjCioId(pAVar6);
            pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,(iVar3 + iVar4) - p->nTruePos);
          }
          if (((pAVar6->field_5).pData != (void *)0x0) && (pAVar6->TravId != p->nTravIds)) {
            pAVar6->TravId = p->nTravIds;
            Vec_PtrPush(vNodes,pAVar6);
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Ssw_MatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( pObj->pData != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}